

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

void __thiscall
pbrt::AnimatedTransform::FindZeros
          (AnimatedTransform *this,Float c1,Float c2,Float c3,Float c4,Float c5,Float theta,
          Interval tInterval,span<float> zeros,int *nZeros,int depth)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Interval IVar13;
  undefined1 extraout_var_01 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 in_XMM6_Qb;
  float local_78;
  Interval local_58;
  Interval local_50;
  Interval local_48;
  Interval local_40;
  Interval local_38;
  Interval local_30;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  
  local_78 = tInterval.low;
  local_30.low = c3;
  local_30.high = c3;
  auVar23._0_8_ = Interval::operator*(&local_30,tInterval);
  auVar23._8_56_ = extraout_var_01;
  auVar19 = SUB6416(ZEXT464(0xff800000),0);
  fVar1 = auVar23._0_4_ + c2;
  if (-INFINITY < fVar1) {
    auVar19._0_12_ = ZEXT812(0);
    auVar19._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar19,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar1 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar1);
    auVar19 = ZEXT416((int)fVar1 + -1 + (uint)(fVar1 <= 0.0) * 2);
  }
  auVar26 = SUB6416(ZEXT464(0x7f800000),0);
  auVar25 = vmovshdup_avx(auVar23._0_16_);
  fVar1 = auVar25._0_4_ + c2;
  if (fVar1 < INFINITY) {
    auVar25._0_12_ = ZEXT812(0);
    auVar25._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar25,0);
    fVar1 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar1);
    auVar26 = ZEXT416((-(uint)(fVar1 < 0.0) | 1) + (int)fVar1);
  }
  auVar25 = vminss_avx(auVar26,auVar19);
  auVar19 = vmaxss_avx(auVar26,auVar19);
  auVar19 = vinsertps_avx(auVar25,auVar19,0x10);
  local_50 = (Interval)vmovlps_avx(auVar19);
  fVar1 = theta + theta;
  local_38.low = fVar1;
  local_38.high = fVar1;
  IVar13 = Interval::operator*(&local_38,tInterval);
  IVar13 = Cos(IVar13);
  auVar14._0_8_ = Interval::operator*(&local_50,IVar13);
  auVar14._8_56_ = extraout_var_02;
  uVar6 = 0xff800000;
  fVar9 = auVar14._0_4_ + c1;
  if (-INFINITY < fVar9) {
    auVar26._0_12_ = ZEXT812(0);
    auVar26._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar9),auVar26,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar9 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar9);
    uVar6 = (int)fVar9 + -1 + (uint)(fVar9 <= 0.0) * 2;
  }
  uVar7 = 0x7f800000;
  auVar19 = vmovshdup_avx(auVar14._0_16_);
  fVar9 = auVar19._0_4_ + c1;
  if (fVar9 < INFINITY) {
    auVar20._0_12_ = ZEXT812(0);
    auVar20._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar9),auVar20,0);
    fVar9 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar9);
    uVar7 = (-(uint)(fVar9 < 0.0) | 1) + (int)fVar9;
  }
  local_40.low = c5;
  local_40.high = c5;
  auVar15._0_8_ = Interval::operator*(&local_40,tInterval);
  auVar15._8_56_ = extraout_var_03;
  auVar19 = SUB6416(ZEXT464(0xff800000),0);
  fVar9 = auVar15._0_4_ + c4;
  if (-INFINITY < fVar9) {
    auVar21._0_12_ = ZEXT812(0);
    auVar21._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar9),auVar21,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar9 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar9);
    auVar19 = ZEXT416((int)fVar9 + -1 + (uint)(fVar9 <= 0.0) * 2);
  }
  auVar25 = vmovshdup_avx(auVar15._0_16_);
  fVar9 = auVar25._0_4_ + c4;
  auVar25 = vminss_avx(ZEXT416(uVar7),ZEXT416(uVar6));
  auVar26 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar9 < INFINITY) {
    auVar27._0_12_ = ZEXT812(0);
    auVar27._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar9),auVar27,0);
    fVar9 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar9);
    auVar26 = ZEXT416((-(uint)(fVar9 < 0.0) | 1) + (int)fVar9);
  }
  auVar20 = vmaxss_avx(ZEXT416(uVar7),ZEXT416(uVar6));
  auVar21 = vminss_avx(auVar26,auVar19);
  auVar19 = vmaxss_avx(auVar26,auVar19);
  auVar19 = vinsertps_avx(auVar21,auVar19,0x10);
  local_58 = (Interval)vmovlps_avx(auVar19);
  local_48.low = fVar1;
  local_48.high = fVar1;
  IVar13 = Interval::operator*(&local_48,tInterval);
  IVar13 = Sin(IVar13);
  auVar16._0_8_ = Interval::operator*(&local_58,IVar13);
  auVar16._8_56_ = extraout_var_04;
  fVar9 = auVar16._0_4_ + auVar25._0_4_;
  auVar19 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < fVar9) {
    auVar22._0_12_ = ZEXT812(0);
    auVar22._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar9),auVar22,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar9 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar9);
    auVar19 = ZEXT416((int)fVar9 + -1 + (uint)(fVar9 <= 0.0) * 2);
  }
  auVar25 = vmovshdup_avx(auVar16._0_16_);
  fVar9 = auVar25._0_4_ + auVar20._0_4_;
  auVar25 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar9 < INFINITY) {
    auVar28._0_12_ = ZEXT812(0);
    auVar28._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar9),auVar28,0);
    fVar9 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar9);
    auVar25 = ZEXT416((-(uint)(fVar9 < 0.0) | 1) + (int)fVar9);
  }
  auVar26 = vminss_avx(auVar25,auVar19);
  fVar9 = auVar26._0_4_;
  if (fVar9 <= 0.0) {
    auVar19 = vmaxss_avx(auVar25,auVar19);
    fVar12 = auVar19._0_4_;
    if (0.0 <= fVar12) {
      if ((fVar9 != fVar12) || (NAN(fVar9) || NAN(fVar12))) {
        if (((int)nZeros < 1) || (fVar12 - fVar9 <= 0.001)) {
          auVar5._8_8_ = in_XMM6_Qb;
          auVar5._0_8_ = tInterval;
          iVar8 = 4;
          auVar19 = vmovshdup_avx(auVar5);
          fVar9 = (local_78 + auVar19._0_4_) * 0.5;
          auVar23 = ZEXT464((uint)c3);
          do {
            auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar9),auVar23._0_16_,ZEXT416((uint)c2));
            auVar17._0_4_ = cosf(fVar9 * fVar1);
            auVar17._4_60_ = extraout_var;
            auVar26 = vfmadd213ss_fma(auVar17._0_16_,ZEXT416((uint)auVar25._0_4_),ZEXT416((uint)c1))
            ;
            auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)c5),ZEXT416((uint)c4));
            fVar24 = auVar20._0_4_;
            auVar18._0_4_ = sinf(fVar9 * fVar1);
            auVar18._4_60_ = extraout_var_00;
            auVar26 = vfmadd213ss_fma(auVar18._0_16_,ZEXT416((uint)fVar24),ZEXT416(auVar26._0_4_));
            fVar10 = auVar26._0_4_;
            fVar12 = (fVar9 + fVar9) * theta;
            fVar11 = cosf(fVar12);
            fVar12 = sinf(fVar12);
            if ((fVar10 == 0.0) && (!NAN(fVar10))) break;
            auVar25 = vfmadd213ss_fma(ZEXT416((uint)(auVar25._0_4_ * -2.0)),ZEXT416((uint)theta),
                                      ZEXT416((uint)c5));
            auVar26 = vfmadd213ss_fma(ZEXT416((uint)(fVar24 + fVar24)),ZEXT416((uint)theta),
                                      ZEXT416((uint)c3));
            auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar11),auVar26,
                                      ZEXT416((uint)(auVar25._0_4_ * fVar12)));
            fVar12 = auVar25._0_4_;
            if ((fVar12 == 0.0) && (!NAN(fVar12))) break;
            iVar8 = iVar8 + -1;
            auVar23 = ZEXT1664(ZEXT416((uint)c3));
            fVar9 = fVar9 - fVar10 / fVar12;
          } while (iVar8 != 0);
          if ((local_78 + -0.001 <= fVar9) && (fVar9 < auVar19._0_4_ + 0.001)) {
            iVar8 = *(int *)zeros.n;
            (this->startTransform).m.m[0][iVar8] = fVar9;
            *(int *)zeros.n = iVar8 + 1;
          }
        }
        else {
          auVar4._8_8_ = in_XMM6_Qb;
          auVar4._0_8_ = tInterval;
          uVar6 = (int)nZeros - 1;
          auVar26 = vmovshdup_avx(auVar4);
          fVar1 = (local_78 + auVar26._0_4_) * 0.5;
          auVar25 = vminss_avx(ZEXT416((uint)fVar1),auVar4);
          auVar19 = vmaxss_avx(ZEXT416((uint)fVar1),auVar4);
          auVar19 = vinsertps_avx(auVar25,auVar19,0x10);
          FindZeros(this,c1,c2,c3,c4,c5,theta,auVar19._0_8_,zeros,(int *)(ulong)uVar6,depth);
          auVar25 = vminss_avx(auVar26,ZEXT416((uint)fVar1));
          auVar19 = vmaxss_avx(auVar26,ZEXT416((uint)fVar1));
          auVar19 = vinsertps_avx(auVar25,auVar19,0x10);
          FindZeros(this,c1,c2,c3,c4,c5,theta,auVar19._0_8_,zeros,(int *)(ulong)uVar6,depth);
        }
      }
    }
  }
  return;
}

Assistant:

void AnimatedTransform::FindZeros(Float c1, Float c2, Float c3, Float c4, Float c5,
                                  Float theta, Interval tInterval,
                                  pstd::span<Float> zeros, int *nZeros, int depth) {
    // Evaluate motion derivative in interval form, return if no zeros
    Interval dadt =
        Interval(c1) +
        (Interval(c2) + Interval(c3) * tInterval) * Cos(Interval(2 * theta) * tInterval) +
        (Interval(c4) + Interval(c5) * tInterval) * Sin(Interval(2 * theta) * tInterval);
    if (dadt.LowerBound() > 0 || dadt.UpperBound() < 0 ||
        dadt.LowerBound() == dadt.UpperBound())
        return;

    // Either split range and recurse or report a zero
    if (depth > 0 && dadt.Width() > 1e-3) {
        // Split _tInterval_ and check both resulting intervals
        Float mid = tInterval.Midpoint();
        FindZeros(c1, c2, c3, c4, c5, theta, Interval(tInterval.LowerBound(), mid), zeros,
                  nZeros, depth - 1);
        FindZeros(c1, c2, c3, c4, c5, theta, Interval(mid, tInterval.UpperBound()), zeros,
                  nZeros, depth - 1);

    } else {
        // Use Newton's method to refine zero
        Float tNewton = tInterval.Midpoint();
        for (int i = 0; i < 4; ++i) {
            // Evaluate motion function derivative and its derivative at _tNewton_
            Float fNewton = c1 + (c2 + c3 * tNewton) * std::cos(2 * theta * tNewton) +
                            (c4 + c5 * tNewton) * std::sin(2 * theta * tNewton);
            Float fPrimeNewton =
                (c3 + 2 * (c4 + c5 * tNewton) * theta) * std::cos(2 * tNewton * theta) +
                (c5 - 2 * (c2 + c3 * tNewton) * theta) * std::sin(2 * tNewton * theta);

            if (fNewton == 0 || fPrimeNewton == 0)
                break;
            tNewton = tNewton - fNewton / fPrimeNewton;
        }

        // Record zero if refined zero is in interval
        if (tNewton >= tInterval.LowerBound() - 1e-3f &&
            tNewton < tInterval.UpperBound() + 1e-3f) {
            zeros[*nZeros] = tNewton;
            (*nZeros)++;
        }
    }
}